

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void ShowAllRooms(void)

{
  Room *pRVar1;
  ostream *poVar2;
  char *pcVar3;
  int i;
  long lVar4;
  long lVar5;
  
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < Admin::Innopolis->rooms_len; lVar4 = lVar4 + 1) {
    pRVar1 = Admin::Innopolis->rooms;
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,*(int *)((long)&pRVar1->room_id + lVar5));
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,*(char **)((long)&pRVar1->name + lVar5));
    poVar2 = std::operator<<(poVar2," ");
    pcVar3 = Room::getAccessLevel((Room *)((long)&pRVar1->name + lVar5));
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar5 = lVar5 + 0x28;
  }
  return;
}

Assistant:

void ShowAllRooms(){
    Room* user;
    for(int i=0;i<Admin::Innopolis->rooms_len;i++){
        user =&(Admin::Innopolis->rooms[i]);
        cout<<user->room_id<<" "<<user->getName()<<" "<<user->getAccessLevel()<<endl;
    }
}